

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

MQTT_MESSAGE_HANDLE
mqttmessage_create_in_place
          (uint16_t packetId,char *topicName,QOS_VALUE qosValue,uint8_t *appMsg,size_t appMsgLength)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MQTT_MESSAGE *result;
  size_t appMsgLength_local;
  uint8_t *appMsg_local;
  QOS_VALUE qosValue_local;
  char *topicName_local;
  uint16_t packetId_local;
  
  if (topicName == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"mqttmessage_create_in_place",0x34,1,
                "Invalid Parameter topicName: %p, packetId: %d.",0,(uint)packetId);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)create_msg_object(packetId,qosValue);
    if ((MQTT_MESSAGE *)l == (MQTT_MESSAGE *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                  ,"mqttmessage_create_in_place",0x3d,1,"Failure creating message object");
      }
    }
    else {
      ((MQTT_MESSAGE *)l)->const_topic_name = topicName;
      (((MQTT_MESSAGE *)l)->const_payload).length = appMsgLength;
      if ((((MQTT_MESSAGE *)l)->const_payload).length != 0) {
        (((MQTT_MESSAGE *)l)->const_payload).message = appMsg;
      }
    }
  }
  return (MQTT_MESSAGE_HANDLE)l;
}

Assistant:

MQTT_MESSAGE_HANDLE mqttmessage_create_in_place(uint16_t packetId, const char* topicName, QOS_VALUE qosValue, const uint8_t* appMsg, size_t appMsgLength)
{
    /* Codes_SRS_MQTTMESSAGE_07_026: [If the parameters topicName is NULL then mqttmessage_create_in_place shall return NULL.].] */
    MQTT_MESSAGE* result;
    if (topicName == NULL)
    {
        LogError("Invalid Parameter topicName: %p, packetId: %d.", topicName, packetId);
        result = NULL;
    }
    else
    {
        result = create_msg_object(packetId, qosValue);
        if (result == NULL)
        {
            /* Codes_SRS_MQTTMESSAGE_07_028: [If any memory allocation fails mqttmessage_create_in_place shall free any allocated memory and return NULL.] */
            LogError("Failure creating message object");
        }
        else
        {
            /* Codes_SRS_MQTTMESSAGE_07_027: [mqttmessage_create_in_place shall use the a pointer to topicName or appMsg .] */
            result->const_topic_name = topicName;
            result->const_payload.length = appMsgLength;
            if (result->const_payload.length > 0)
            {
                result->const_payload.message = (uint8_t*)appMsg;
            }
        }
    }
    /* Codes_SRS_MQTTMESSAGE_07_029: [ Upon success, mqttmessage_create_in_place shall return a NON-NULL MQTT_MESSAGE_HANDLE value.] */
    return (MQTT_MESSAGE_HANDLE)result;
}